

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_export.c
# Opt level: O1

REF_STATUS ref_export_tec_ed3_zone(REF_GRID ref_grid,FILE *file)

{
  REF_CELL ref_cell;
  REF_DBL *pRVar1;
  uint uVar2;
  REF_STATUS RVar3;
  uint uVar4;
  long lVar5;
  undefined8 uVar6;
  REF_NODE pRVar7;
  char *pcVar8;
  int iVar9;
  long lVar10;
  REF_INT nnode;
  REF_DICT ref_dict;
  REF_INT *g2l;
  REF_INT nedge;
  REF_INT *l2g;
  REF_INT nodes [27];
  uint local_e4;
  REF_DICT local_e0;
  REF_INT *local_d8;
  int local_cc;
  REF_INT *local_c8;
  REF_GRID local_c0;
  long local_b8;
  REF_NODE local_b0;
  uint local_a8 [30];
  
  pRVar7 = ref_grid->node;
  uVar2 = ref_dict_create(&local_e0);
  if (uVar2 == 0) {
    ref_cell = ref_grid->cell[2];
    local_c0 = ref_grid;
    if (0 < ref_cell->max) {
      iVar9 = 0;
      do {
        RVar3 = ref_cell_nodes(ref_cell,iVar9,(REF_INT *)local_a8);
        if ((RVar3 == 0) &&
           (uVar2 = ref_dict_store(local_e0,local_a8[ref_cell->node_per],-1), uVar2 != 0)) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
                 0x163,"ref_export_tec_ed3_zone",(ulong)uVar2,"mark tri");
          return uVar2;
        }
        iVar9 = iVar9 + 1;
      } while (iVar9 < ref_cell->max);
    }
    if (local_e0->n < 1) {
      uVar2 = 0xffffffff;
    }
    else {
      uVar2 = *local_e0->key;
    }
    if (0 < local_e0->n) {
      lVar10 = 0;
      local_b0 = pRVar7;
      do {
        local_b8 = lVar10;
        uVar4 = ref_grid_cell_id_nodes
                          (local_c0,ref_cell,uVar2,(REF_INT *)&local_e4,&local_cc,&local_d8,
                           &local_c8);
        if (uVar4 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
                 0x169,"ref_export_tec_ed3_zone",(ulong)uVar4,"extract this edge");
          return uVar4;
        }
        fprintf((FILE *)file,
                "zone t=\"p3edge%d\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n",
                (ulong)uVar2,(ulong)local_e4,(ulong)(uint)(local_cc * 3),"point","felineseg");
        if (0 < (int)local_e4) {
          lVar10 = 0;
          do {
            pRVar1 = pRVar7->real;
            lVar5 = (long)local_c8[lVar10];
            fprintf((FILE *)file," %.16e %.16e %.16e\n",pRVar1[lVar5 * 0xf],pRVar1[lVar5 * 0xf + 1],
                    pRVar1[lVar5 * 0xf + 2]);
            lVar10 = lVar10 + 1;
          } while (lVar10 < (int)local_e4);
        }
        if (0 < ref_cell->max) {
          iVar9 = 0;
          do {
            RVar3 = ref_cell_nodes(ref_cell,iVar9,(REF_INT *)local_a8);
            if ((RVar3 == 0) && (uVar2 == local_a8[ref_cell->node_per])) {
              fprintf((FILE *)file," %d %d\n",(ulong)(local_d8[(int)local_a8[0]] + 1),
                      (ulong)(local_d8[(int)local_a8[2]] + 1));
              fprintf((FILE *)file," %d %d\n",(ulong)(local_d8[(int)local_a8[2]] + 1),
                      (ulong)(local_d8[(int)local_a8[3]] + 1));
              pRVar7 = local_b0;
              fprintf((FILE *)file," %d %d\n",(ulong)(local_d8[(int)local_a8[3]] + 1),
                      (ulong)(local_d8[(int)local_a8[1]] + 1));
            }
            iVar9 = iVar9 + 1;
          } while (iVar9 < ref_cell->max);
        }
        if (local_c8 != (REF_INT *)0x0) {
          free(local_c8);
        }
        if (local_d8 != (REF_INT *)0x0) {
          free(local_d8);
        }
        lVar10 = local_b8 + 1;
        uVar2 = 0xffffffff;
        if (lVar10 < local_e0->n) {
          uVar2 = local_e0->key[lVar10];
        }
      } while (lVar10 < local_e0->n);
    }
    uVar2 = ref_dict_free(local_e0);
    if (uVar2 == 0) {
      return 0;
    }
    pcVar8 = "free dict";
    uVar6 = 0x182;
  }
  else {
    pcVar8 = "create dict";
    uVar6 = 0x15e;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",uVar6,
         "ref_export_tec_ed3_zone",(ulong)uVar2,pcVar8);
  return uVar2;
}

Assistant:

REF_FCN static REF_STATUS ref_export_tec_ed3_zone(REF_GRID ref_grid,
                                                  FILE *file) {
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_INT node;
  REF_INT *g2l, *l2g;
  REF_INT nedge;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT cell;
  REF_INT nnode;
  REF_DICT ref_dict;
  REF_INT boundary_tag, boundary_index;

  ref_node = ref_grid_node(ref_grid);

  RSS(ref_dict_create(&ref_dict), "create dict");

  ref_cell = ref_grid_ed3(ref_grid);
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    RSS(ref_dict_store(ref_dict, nodes[ref_cell_id_index(ref_cell)], REF_EMPTY),
        "mark tri");
  }

  each_ref_dict_key(ref_dict, boundary_index, boundary_tag) {
    RSS(ref_grid_cell_id_nodes(ref_grid, ref_cell, boundary_tag, &nnode, &nedge,
                               &g2l, &l2g),
        "extract this edge");

    fprintf(file,
            "zone t=\"p3edge%d\", nodes=%d, elements=%d, datapacking=%s, "
            "zonetype=%s\n",
            boundary_tag, nnode, 3 * nedge, "point", "felineseg");

    for (node = 0; node < nnode; node++)
      fprintf(file, " %.16e %.16e %.16e\n",
              ref_node_xyz(ref_node, 0, l2g[node]),
              ref_node_xyz(ref_node, 1, l2g[node]),
              ref_node_xyz(ref_node, 2, l2g[node]));

    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      if (boundary_tag == nodes[ref_cell_id_index(ref_cell)]) {
        fprintf(file, " %d %d\n", g2l[nodes[0]] + 1, g2l[nodes[2]] + 1);
        fprintf(file, " %d %d\n", g2l[nodes[2]] + 1, g2l[nodes[3]] + 1);
        fprintf(file, " %d %d\n", g2l[nodes[3]] + 1, g2l[nodes[1]] + 1);
      }
    }

    ref_free(l2g);
    ref_free(g2l);
  }

  RSS(ref_dict_free(ref_dict), "free dict");

  return REF_SUCCESS;
}